

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * despot::util::tinyxml::TiXmlBase::GetEntity
                 (char *p,char *value,int *length,TiXmlEncoding encoding)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  unsigned_long input;
  long lVar8;
  bool bVar9;
  
  *length = 0;
  if (p[1] != '#') {
LAB_0017308a:
    lVar8 = 0xc;
    do {
      pcVar4 = *(char **)(errorString + lVar8 + 0x84);
      uVar7 = *(uint *)(lVar8 + 0x193d6c);
      iVar1 = strncmp(pcVar4,p,(ulong)uVar7);
      if (iVar1 == 0) {
        sVar2 = strlen(pcVar4);
        if (sVar2 != uVar7) {
          __assert_fail("strlen(entity[i].str) == entity[i].strLength",
                        "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                        ,0x1df,
                        "static const char *despot::util::tinyxml::TiXmlBase::GetEntity(const char *, char *, int *, TiXmlEncoding)"
                       );
        }
        *value = *(char *)((long)&entity + lVar8);
        *length = 1;
        return p + *(uint *)(lVar8 + 0x193d6c);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x5c);
    *value = *p;
    return p + 1;
  }
  if (p[2] == 'x') {
    if (p[3] == '\0') {
      return (char *)0x0;
    }
    pcVar4 = strchr(p + 3,0x3b);
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
LAB_001731d4:
      input = 0;
      lVar8 = 0;
LAB_001731d9:
      bVar9 = false;
      goto LAB_001731db;
    }
    lVar8 = (long)pcVar4 - (long)p;
    bVar5 = pcVar4[-1];
    bVar9 = true;
    if (bVar5 != 0x78) {
      pbVar3 = (byte *)(pcVar4 + -2);
      iVar1 = 1;
      input = 0;
      do {
        if ((byte)(bVar5 - 0x30) < 10) {
          uVar7 = (uint)(byte)(bVar5 - 0x30);
        }
        else if ((byte)(bVar5 + 0x9f) < 6) {
          uVar7 = bVar5 - 0x57;
        }
        else {
          if (5 < (byte)(bVar5 + 0xbf)) goto LAB_001731d9;
          uVar7 = bVar5 - 0x37;
        }
        input = input + uVar7 * iVar1;
        iVar1 = iVar1 << 4;
        bVar5 = *pbVar3;
        pbVar3 = pbVar3 + -1;
      } while (bVar5 != 0x78);
      goto LAB_001731db;
    }
  }
  else {
    if (p[2] == '\0') goto LAB_0017308a;
    pcVar4 = strchr(p + 2,0x3b);
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) goto LAB_001731d4;
    lVar8 = (long)pcVar4 - (long)p;
    cVar6 = pcVar4[-1];
    if (cVar6 != '#') {
      pcVar4 = pcVar4 + -2;
      iVar1 = 1;
      input = 0;
      do {
        bVar9 = (byte)(cVar6 - 0x30U) < 10;
        if (!bVar9) break;
        input = input + (uint)(byte)(cVar6 - 0x30U) * iVar1;
        iVar1 = iVar1 * 10;
        cVar6 = *pcVar4;
        pcVar4 = pcVar4 + -1;
      } while (cVar6 != '#');
      goto LAB_001731db;
    }
  }
  bVar9 = true;
  input = 0;
LAB_001731db:
  if (!bVar9) {
    return (char *)0x0;
  }
  if (encoding == TIXML_ENCODING_UTF8) {
    ConvertUTF32ToUTF8(input,value,length);
  }
  else {
    *value = (char)input;
    *length = 1;
  }
  return p + lVar8 + 1;
}

Assistant:

const char* TiXmlBase::GetEntity(const char* p, char* value, int* length,
	TiXmlEncoding encoding) {
	// Presume an entity, and pull it out.
	TIXML_STRING ent;
	int i;
	*length = 0;

	if (*(p + 1) && *(p + 1) == '#' && *(p + 2)) {
		unsigned long ucs = 0;
		ptrdiff_t delta = 0;
		unsigned mult = 1;

		if (*(p + 2) == 'x') {
			// Hexadecimal.
			if (!*(p + 3))
				return 0;

			const char* q = p + 3;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != 'x') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else if (*q >= 'a' && *q <= 'f')
					ucs += mult * (*q - 'a' + 10);
				else if (*q >= 'A' && *q <= 'F')
					ucs += mult * (*q - 'A' + 10);
				else
					return 0;
				mult *= 16;
				--q;
			}
		} else {
			// Decimal.
			if (!*(p + 2))
				return 0;

			const char* q = p + 2;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != '#') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else
					return 0;
				mult *= 10;
				--q;
			}
		}
		if (encoding == TIXML_ENCODING_UTF8) {
			// convert the UCS to UTF-8
			ConvertUTF32ToUTF8(ucs, value, length);
		} else {
			*value = (char) ucs;
			*length = 1;
		}
		return p + delta + 1;
	}

	// Now try to match it.
	for (i = 0; i < NUM_ENTITY; ++i) {
		if (strncmp(entity[i].str, p, entity[i].strLength) == 0) {
			assert(strlen(entity[i].str) == entity[i].strLength);
			*value = entity[i].chr;
			*length = 1;
			return (p + entity[i].strLength);
		}
	}

	// So it wasn't an entity, its unrecognized, or something like that.
	*value = *p; // Don't put back the last one, since we return it!
	//*length = 1;	// Leave unrecognized entities - this doesn't really work.
	// Just writes strange XML.
	return p + 1;
}